

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O1

void __thiscall
soul::heart::Utilities::
GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
::addNode(GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
          *this,ProcessorInstance *p)

{
  undefined1 local_70 [96];
  
  local_70._8_8_ = local_70 + 0x20;
  local_70._16_8_ = 0;
  local_70._24_8_ = 4;
  local_70._0_8_ = p;
  std::
  vector<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node,std::allocator<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node>>
  ::
  emplace_back<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node>
            ((vector<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node,std::allocator<soul::heart::Utilities::GraphTraversalHelper<soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector,soul::AST::ProcessorInstance,soul::AST::Connection,soul::AST::Context>::Node>>
              *)this,(Node *)local_70);
  local_70._16_8_ = 0;
  if ((4 < (ulong)local_70._24_8_) && ((Source *)local_70._8_8_ != (Source *)0x0)) {
    operator_delete__((void *)local_70._8_8_);
  }
  return;
}

Assistant:

static Type replaceUsesOfStruct (Type type, Structure& oldStruct, Structure& newStruct)
    {
        if (type.isArray())
            return type.createCopyWithNewArrayElementType (replaceUsesOfStruct (type.getElementType(), oldStruct, newStruct));

        if (type.isStruct())
        {
            if (type.getStruct() == oldStruct)
                return Type::createStruct (newStruct);

            for (auto& m : type.getStructRef().getMembers())
                if (m.type.usesStruct (oldStruct))
                    m.type = replaceUsesOfStruct (m.type, oldStruct, newStruct);
        }

        return type;
    }